

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerGLSL::variable_decl
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,string *name,uint32_t id
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_68,this,type,(ulong)id);
  if ((this->super_Compiler).variable_remap_callback.super__Function_base._M_manager !=
      (_Manager_type)0x0) {
    (*(this->super_Compiler).variable_remap_callback._M_invoker)
              ((_Any_data *)&(this->super_Compiler).variable_remap_callback,type,name,&local_68);
  }
  (*(this->super_Compiler)._vptr_Compiler[0x27])(&local_48,this,type,id);
  join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)&local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36a6d9,
             (char (*) [2])name,&local_48,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::variable_decl(const SPIRType &type, const string &name, uint32_t id)
{
	string type_name = type_to_glsl(type, id);
	remap_variable_type_name(type, name, type_name);
	return join(type_name, " ", name, type_to_array_glsl(type, id));
}